

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * duckdb::Exception::ConstructMessageRecursive<unsigned_char>
                   (string *__return_storage_ptr__,string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,uchar param)

{
  undefined1 auStack_58 [56];
  
  ExceptionFormatValue::CreateFormatValue<unsigned_char>((ExceptionFormatValue *)auStack_58,param);
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>(values,(ExceptionFormatValue *)auStack_58);
  std::__cxx11::string::~string((string *)(auStack_58 + 0x18));
  duckdb::Exception::ConstructMessageRecursive((string *)__return_storage_ptr__,(vector *)msg);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}